

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_f16c.cpp
# Opt level: O2

void ncnn::innerproduct_transform_kernel_fp16s_sse_f16c
               (Mat *weight_data,Mat *weight_data_tm,int num_input,int num_output,Option *opt)

{
  float *pfVar1;
  void *pvVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  void *pvVar6;
  unsigned_short uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  unsigned_short *puVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  long local_f8;
  long local_e8;
  Mat local_c0;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  void *local_40;
  long local_38;
  
  if (opt->use_packing_layout == true) {
    if ((num_output & 7U) == 0) {
      Mat::reshape(&local_c0,weight_data,num_input,num_output,(Allocator *)0x0);
      Mat::create(weight_data_tm,num_input,num_output >> 3,0x10,8,(Allocator *)0x0);
      lVar15 = 7;
      lVar16 = 6;
      lVar8 = 5;
      lVar10 = 4;
      lVar13 = 3;
      lVar14 = 2;
      lVar19 = 1;
      lVar21 = 0;
      for (uVar17 = 0; pvVar6 = local_c0.data, (long)(uVar17 | 7) < (long)num_output;
          uVar17 = uVar17 + 8) {
        local_38 = (long)weight_data_tm->w;
        local_40 = weight_data_tm->data;
        puVar18 = (unsigned_short *)
                  ((uVar17 >> 3) * local_38 * weight_data_tm->elemsize + (long)local_40);
        lVar11 = (long)local_c0.w;
        lVar22 = weight_data_tm->elemsize * lVar21 * local_38;
        lVar12 = 0;
        lVar20 = 0;
        for (iVar9 = 0; iVar9 + 7 < num_input; iVar9 = iVar9 + 8) {
          auVar23 = vcvtps2ph_f16c(*(undefined1 (*) [32])
                                    ((long)local_c0.data +
                                    lVar20 + local_c0.elemsize * uVar17 * lVar11),3);
          auVar25 = vcvtps2ph_f16c(*(undefined1 (*) [32])
                                    ((long)local_c0.data +
                                    lVar20 + local_c0.elemsize * lVar19 * lVar11),3);
          auVar27 = vcvtps2ph_f16c(*(undefined1 (*) [32])
                                    ((long)local_c0.data +
                                    lVar20 + local_c0.elemsize * lVar14 * lVar11),3);
          auVar28 = vcvtps2ph_f16c(*(undefined1 (*) [32])
                                    ((long)local_c0.data +
                                    lVar20 + local_c0.elemsize * lVar13 * lVar11),3);
          auVar29 = vcvtps2ph_f16c(*(undefined1 (*) [32])
                                    ((long)local_c0.data +
                                    lVar20 + local_c0.elemsize * lVar10 * lVar11),3);
          auVar30 = vcvtps2ph_f16c(*(undefined1 (*) [32])
                                    ((long)local_c0.data +
                                    lVar20 + local_c0.elemsize * lVar8 * lVar11),3);
          auVar31 = vcvtps2ph_f16c(*(undefined1 (*) [32])
                                    ((long)local_c0.data +
                                    lVar20 + local_c0.elemsize * lVar16 * lVar11),3);
          auVar32 = vcvtps2ph_f16c(*(undefined1 (*) [32])
                                    ((long)local_c0.data +
                                    lVar20 + local_c0.elemsize * lVar15 * lVar11),3);
          auVar4 = vpunpcklwd_avx(auVar23,auVar25);
          auVar23 = vpunpckhwd_avx(auVar23,auVar25);
          auVar5 = vpunpcklwd_avx(auVar27,auVar28);
          auVar25 = vpunpckhwd_avx(auVar27,auVar28);
          auVar3 = vpunpcklwd_avx(auVar29,auVar30);
          auVar27 = vpunpckhwd_avx(auVar29,auVar30);
          auVar29 = vpunpcklwd_avx(auVar31,auVar32);
          auVar28 = vpunpckhwd_avx(auVar31,auVar32);
          auVar30 = vpunpckldq_avx(auVar4,auVar5);
          auVar4 = vpunpckhdq_avx(auVar4,auVar5);
          auVar5 = vpunpckldq_avx(auVar23,auVar25);
          auVar23 = vpunpckhdq_avx(auVar23,auVar25);
          auVar31 = vpunpckldq_avx(auVar3,auVar29);
          auVar25 = vpunpckhdq_avx(auVar3,auVar29);
          auVar3 = vpunpckldq_avx(auVar27,auVar28);
          auVar27 = vpunpckhdq_avx(auVar27,auVar28);
          auVar29 = vpunpcklqdq_avx(auVar30,auVar31);
          auVar28 = vpunpckhqdq_avx(auVar30,auVar31);
          auVar30 = vpunpcklqdq_avx(auVar4,auVar25);
          auVar25 = vpunpckhqdq_avx(auVar4,auVar25);
          auVar31 = vpunpcklqdq_avx(auVar5,auVar3);
          auVar4 = vpunpckhqdq_avx(auVar5,auVar3);
          auVar5 = vpunpcklqdq_avx(auVar23,auVar27);
          auVar23 = vpunpckhqdq_avx(auVar23,auVar27);
          *(undefined1 (*) [16])((long)local_40 + lVar20 * 4 + lVar22) = auVar29;
          *(undefined1 (*) [16])((long)local_40 + lVar20 * 4 + lVar22 + 0x10) = auVar28;
          *(undefined1 (*) [16])((long)local_40 + lVar20 * 4 + lVar22 + 0x20) = auVar30;
          *(undefined1 (*) [16])((long)local_40 + lVar20 * 4 + lVar22 + 0x30) = auVar25;
          *(undefined1 (*) [16])((long)local_40 + lVar20 * 4 + lVar22 + 0x40) = auVar31;
          *(undefined1 (*) [16])((long)local_40 + lVar20 * 4 + lVar22 + 0x50) = auVar4;
          *(undefined1 (*) [16])((long)local_40 + lVar20 * 4 + lVar22 + 0x60) = auVar5;
          *(undefined1 (*) [16])((long)local_40 + lVar20 * 4 + lVar22 + 0x70) = auVar23;
          puVar18 = puVar18 + 0x40;
          lVar20 = lVar20 + 0x20;
          lVar12 = lVar12 + 8;
        }
        lVar11 = local_c0.elemsize * lVar11;
        local_78 = lVar19;
        local_70 = lVar14;
        local_68 = lVar13;
        local_60 = lVar10;
        local_58 = lVar8;
        local_50 = lVar16;
        local_48 = lVar15;
        for (; (int)lVar12 < num_input; lVar12 = lVar12 + 1) {
          pfVar1 = (float *)((long)pvVar6 + lVar12 * 4 + lVar11 * uVar17);
          uVar7 = float32_to_float16(*pfVar1);
          *puVar18 = uVar7;
          uVar7 = float32_to_float16(*(float *)((long)pfVar1 + lVar11));
          puVar18[1] = uVar7;
          uVar7 = float32_to_float16(*(float *)((long)pfVar1 + lVar11 * 2));
          puVar18[2] = uVar7;
          uVar7 = float32_to_float16(*(float *)((long)pfVar1 + lVar11 * 3));
          puVar18[3] = uVar7;
          uVar7 = float32_to_float16(pfVar1[lVar11]);
          puVar18[4] = uVar7;
          uVar7 = float32_to_float16(*(float *)((long)pfVar1 + lVar11 * 5));
          puVar18[5] = uVar7;
          uVar7 = float32_to_float16(*(float *)((long)pfVar1 + lVar11 * 6));
          puVar18[6] = uVar7;
          uVar7 = float32_to_float16(*(float *)((long)pfVar1 + lVar11 * 7));
          puVar18[7] = uVar7;
          puVar18 = puVar18 + 8;
        }
        lVar15 = local_48 + 8;
        lVar16 = local_50 + 8;
        lVar8 = local_58 + 8;
        lVar10 = local_60 + 8;
        lVar13 = local_68 + 8;
        lVar14 = local_70 + 8;
        lVar19 = local_78 + 8;
        lVar21 = lVar21 + 1;
      }
      if (local_c0.refcount == (int *)0x0) {
        return;
      }
      LOCK();
      *local_c0.refcount = *local_c0.refcount + -1;
      UNLOCK();
      if (*local_c0.refcount != 0) {
        return;
      }
      if (local_c0.allocator != (Allocator *)0x0) {
        (*(local_c0.allocator)->_vptr_Allocator[3])();
        return;
      }
      goto LAB_0030746e;
    }
    if ((num_output & 3U) == 0) {
      Mat::reshape(&local_c0,weight_data,num_input,num_output,(Allocator *)0x0);
      Mat::create(weight_data_tm,num_input,num_output >> 2,8,4,(Allocator *)0x0);
      local_e8 = 3;
      local_f8 = 2;
      lVar15 = 1;
      lVar16 = 0;
      for (uVar17 = 0; pvVar6 = local_c0.data, (long)(uVar17 | 3) < (long)num_output;
          uVar17 = uVar17 + 4) {
        lVar10 = (long)local_c0.w;
        lVar21 = weight_data_tm->elemsize * lVar16 * (long)weight_data_tm->w;
        pvVar2 = weight_data_tm->data;
        lVar13 = local_c0.elemsize * uVar17 * lVar10;
        lVar22 = local_c0.elemsize * lVar15 * lVar10;
        lVar19 = local_c0.elemsize * local_f8 * lVar10;
        lVar10 = local_c0.elemsize * local_e8 * lVar10;
        lVar14 = 0;
        lVar8 = 0;
        for (iVar9 = 0; iVar9 + 3 < num_input; iVar9 = iVar9 + 4) {
          auVar23 = *(undefined1 (*) [16])((long)local_c0.data + lVar8 + lVar13);
          auVar25 = *(undefined1 (*) [16])((long)local_c0.data + lVar8 + lVar22);
          auVar27 = *(undefined1 (*) [16])((long)local_c0.data + lVar8 + lVar19);
          auVar28 = *(undefined1 (*) [16])((long)local_c0.data + lVar8 + lVar10);
          auVar4 = vpunpckldq_avx(auVar23,auVar25);
          auVar5 = vpunpckldq_avx(auVar27,auVar28);
          auVar23 = vpunpckhdq_avx(auVar23,auVar25);
          auVar25 = vpunpckhdq_avx(auVar27,auVar28);
          auVar28 = vpunpcklqdq_avx(auVar4,auVar5);
          auVar27 = vpunpckhqdq_avx(auVar4,auVar5);
          auVar4 = vpunpcklqdq_avx(auVar23,auVar25);
          auVar23 = vpunpckhqdq_avx(auVar23,auVar25);
          auVar26._16_16_ = auVar27;
          auVar26._0_16_ = auVar28;
          auVar24._16_16_ = auVar23;
          auVar24._0_16_ = auVar4;
          auVar23 = vcvtps2ph_f16c(auVar26,3);
          *(undefined1 (*) [16])((long)pvVar2 + lVar8 * 2 + lVar21) = auVar23;
          auVar23 = vcvtps2ph_f16c(auVar24,3);
          *(undefined1 (*) [16])((long)pvVar2 + lVar8 * 2 + lVar21 + 0x10) = auVar23;
          lVar8 = lVar8 + 0x10;
          lVar14 = lVar14 + 4;
        }
        for (; (int)lVar14 < num_input; lVar14 = lVar14 + 1) {
          uVar7 = float32_to_float16(*(float *)((long)pvVar6 + lVar14 * 4 + lVar13));
          *(unsigned_short *)((long)pvVar2 + lVar14 * 8 + lVar21) = uVar7;
          uVar7 = float32_to_float16(*(float *)((long)pvVar6 + lVar14 * 4 + lVar22));
          *(unsigned_short *)((long)pvVar2 + lVar14 * 8 + lVar21 + 2) = uVar7;
          uVar7 = float32_to_float16(*(float *)((long)pvVar6 + lVar14 * 4 + lVar19));
          *(unsigned_short *)((long)pvVar2 + lVar14 * 8 + lVar21 + 4) = uVar7;
          uVar7 = float32_to_float16(*(float *)((long)pvVar6 + lVar14 * 4 + lVar10));
          *(unsigned_short *)((long)pvVar2 + lVar14 * 8 + lVar21 + 6) = uVar7;
        }
        lVar16 = lVar16 + 1;
        lVar15 = lVar15 + 4;
        local_f8 = local_f8 + 4;
        local_e8 = local_e8 + 4;
      }
      if (local_c0.refcount == (int *)0x0) {
        return;
      }
      LOCK();
      *local_c0.refcount = *local_c0.refcount + -1;
      UNLOCK();
      if (*local_c0.refcount != 0) {
        return;
      }
      if (local_c0.allocator != (Allocator *)0x0) {
        (*(local_c0.allocator)->_vptr_Allocator[3])();
        return;
      }
      goto LAB_0030746e;
    }
  }
  Mat::reshape(&local_c0,weight_data,num_input,num_output,(Allocator *)0x0);
  cast_float32_to_float16(&local_c0,weight_data_tm,opt);
  if (local_c0.refcount == (int *)0x0) {
    return;
  }
  LOCK();
  *local_c0.refcount = *local_c0.refcount + -1;
  UNLOCK();
  if (*local_c0.refcount != 0) {
    return;
  }
  if (local_c0.allocator != (Allocator *)0x0) {
    (*(local_c0.allocator)->_vptr_Allocator[3])();
    return;
  }
LAB_0030746e:
  free(local_c0.data);
  return;
}

Assistant:

void innerproduct_transform_kernel_fp16s_sse_f16c(const Mat& weight_data, Mat& weight_data_tm, int num_input, int num_output, const Option& opt)
{
    innerproduct_transform_kernel_fp16s_sse(weight_data, weight_data_tm, num_input, num_output, opt);
}